

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreprocessorTests.cpp
# Opt level: O0

optional<slang::TimeScale> lexTimeScale(string_view text)

{
  StringRef capturedExpression;
  StringRef macroName;
  optional<slang::TimeScale> oVar1;
  SourceManager *pSVar2;
  TimeScale *pTVar3;
  AssertionHandler *this;
  Token TVar4;
  Bag *in_stack_00000038;
  Diagnostics *in_stack_00000040;
  BumpAllocator *in_stack_00000048;
  SourceManager *in_stack_00000050;
  Preprocessor *in_stack_00000058;
  AssertionHandler catchAssertionHandler;
  Token token;
  Preprocessor preprocessor;
  SourceLineInfo *lineInfo;
  SmallVectorBase<slang::Diagnostic> *in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb00;
  SourceLineInfo *this_00;
  Flags resultDisposition;
  SourceLineInfo local_4a0;
  StringRef local_490;
  Preprocessor *in_stack_fffffffffffffb90;
  string_view in_stack_fffffffffffffb98;
  string_view in_stack_fffffffffffffba8;
  size_t local_3f8;
  Preprocessor *pPStack_3f0;
  Preprocessor local_3b0;
  _Storage<slang::TimeScale,_true> local_8;
  bool local_4;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear(in_stack_fffffffffffffaf0);
  pSVar2 = getSourceManager();
  resultDisposition = (Flags)pSVar2;
  slang::Bag::Bag((Bag *)0x637e3f);
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x637e4c);
  slang::parsing::Preprocessor::Preprocessor
            (in_stack_00000058,in_stack_00000050,in_stack_00000048,in_stack_00000040,
             in_stack_00000038,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             preprocessor.options._80_16_);
  slang::Bag::~Bag((Bag *)0x637e8c);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  slang::parsing::Preprocessor::pushSource
            (in_stack_fffffffffffffb90,in_stack_fffffffffffffba8,in_stack_fffffffffffffb98);
  TVar4 = slang::parsing::Preprocessor::next((Preprocessor *)0x637eec);
  this = (AssertionHandler *)TVar4.info;
  local_490 = operator____catch_sr((char *)pPStack_3f0,local_3f8);
  this_00 = &local_4a0;
  Catch::SourceLineInfo::SourceLineInfo
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/PreprocessorTests.cpp"
             ,0x4cd);
  operator____catch_sr((char *)pPStack_3f0,local_3f8);
  lineInfo = (SourceLineInfo *)CONCAT44((int)(local_3f8 >> 0x20),1);
  macroName.m_size = (size_type)this;
  macroName.m_start = (char *)this_00;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffb00;
  capturedExpression.m_start = in_stack_fffffffffffffaf8;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)pPStack_3f0,macroName,lineInfo,capturedExpression,resultDisposition
            );
  Catch::operator<=<slang::parsing::Token_&,_0>((Decomposer *)lineInfo,(Token *)0x637fb2);
  Catch::AssertionHandler::handleExpr<slang::parsing::Token&>
            (this,(ExprLhs<slang::parsing::Token_&> *)this_00);
  Catch::AssertionHandler::complete((AssertionHandler *)pPStack_3f0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)pPStack_3f0);
  pTVar3 = (TimeScale *)slang::parsing::Preprocessor::getTimeScale(&local_3b0);
  local_4 = (bool)pTVar3[1].base.unit;
  local_8._M_value = *pTVar3;
  slang::parsing::Preprocessor::~Preprocessor(pPStack_3f0);
  oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_4;
  oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload._M_value = local_8._M_value;
  return (optional<slang::TimeScale>)
         oVar1.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
         super__Optional_payload_base<slang::TimeScale>;
}

Assistant:

std::optional<TimeScale> lexTimeScale(std::string_view text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Token token = preprocessor.next();
    REQUIRE(token);
    return preprocessor.getTimeScale();
}